

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlreader.c
# Opt level: O1

xmlChar * xmlTextReaderConstBaseUri(xmlTextReaderPtr reader)

{
  xmlChar *name;
  xmlChar *pxVar1;
  
  if (((reader != (xmlTextReaderPtr)0x0) && (reader->node != (xmlNode *)0x0)) &&
     (name = xmlNodeGetBase((xmlDoc *)0x0,reader->node), name != (xmlChar *)0x0)) {
    pxVar1 = xmlDictLookup(reader->dict,name,-1);
    (*xmlFree)(name);
    return pxVar1;
  }
  return (xmlChar *)0x0;
}

Assistant:

const xmlChar *
xmlTextReaderConstBaseUri(xmlTextReaderPtr reader) {
    xmlChar *tmp;
    const xmlChar *ret;

    if ((reader == NULL) || (reader->node == NULL))
	return(NULL);
    tmp = xmlNodeGetBase(NULL, reader->node);
    if (tmp == NULL)
        return(NULL);
    ret = CONSTSTR(tmp);
    xmlFree(tmp);
    return(ret);
}